

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O1

void __thiscall
soplex::DSVectorBase<double>::DSVectorBase<double>
          (DSVectorBase<double> *this,SVectorBase<double> *old)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  int iVar3;
  Nonzero<double> *pNVar4;
  
  (this->super_SVectorBase<double>).m_elem = (Nonzero<double> *)0x0;
  (this->super_SVectorBase<double>).memsize = 0;
  (this->super_SVectorBase<double>).memused = 0;
  this->_vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
  this->theelem = (Nonzero<double> *)0x0;
  iVar2 = old->memused;
  spx_alloc<soplex::Nonzero<double>*>(&this->theelem,iVar2);
  pNVar1 = this->theelem;
  (this->super_SVectorBase<double>).m_elem = pNVar1;
  (this->super_SVectorBase<double>).memused = 0;
  (this->super_SVectorBase<double>).memsize = iVar2;
  if (&this->super_SVectorBase<double> != old) {
    iVar2 = old->memused;
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    else {
      pNVar4 = old->m_elem;
      iVar3 = 0;
      do {
        if ((pNVar4->val != 0.0) || (NAN(pNVar4->val))) {
          pNVar1->idx = pNVar4->idx;
          pNVar1->val = pNVar4->val;
          pNVar1 = pNVar1 + 1;
          iVar3 = iVar3 + 1;
        }
        iVar2 = iVar2 + -1;
        pNVar4 = pNVar4 + 1;
      } while (iVar2 != 0);
    }
    (this->super_SVectorBase<double>).memused = iVar3;
  }
  return;
}

Assistant:

explicit DSVectorBase(const SVectorBase<S>& old)
      : theelem(nullptr)
   {
      allocMem(old.size());
      SVectorBase<R>::operator=(old);

      assert(isConsistent());
   }